

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_double(nk_context *ctx,char *name,double min,double *val,double max,double step,
                       float inc_per_pixel)

{
  nk_property_variant local_90;
  undefined1 local_68 [8];
  nk_property_variant variant;
  float inc_per_pixel_local;
  double step_local;
  double max_local;
  double *val_local;
  double min_local;
  char *name_local;
  nk_context *ctx_local;
  
  variant.step._4_4_ = inc_per_pixel;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5cbc,
                  "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5cbd,
                  "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
                 );
  }
  if (val == (double *)0x0) {
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5cbe,
                  "void nk_property_double(struct nk_context *, const char *, double, double *, double, double, float)"
                 );
  }
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) && (name != (char *)0x0))
     && (val != (double *)0x0)) {
    nk_property_variant_double(&local_90,*val,min,max,step);
    memcpy(local_68,&local_90,0x28);
    nk_property(ctx,name,(nk_property_variant *)local_68,(float)variant.step._4_4_,NK_FILTER_FLOAT);
    *val = (double)variant._0_8_;
  }
  return;
}

Assistant:

NK_API void
nk_property_double(struct nk_context *ctx, const char *name,
    double min, double *val, double max, double step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_double(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    *val = variant.value.d;
}